

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O1

os_specfile_t os_is_special_file(char *fname)

{
  int iVar1;
  os_specfile_t oVar2;
  
  iVar1 = strcmp(fname,".");
  oVar2 = OS_SPECFILE_SELF;
  if (iVar1 != 0) {
    iVar1 = strcmp(fname,"./");
    if (iVar1 != 0) {
      iVar1 = strcmp(fname,"..");
      if (iVar1 == 0) {
        oVar2 = OS_SPECFILE_PARENT;
      }
      else {
        iVar1 = strcmp(fname,"../");
        oVar2 = (uint)(iVar1 == 0) * 2;
      }
    }
  }
  return oVar2;
}

Assistant:

os_specfile_t
os_is_special_file( const char* fname )
{
    // We also check for "./" and "../" instead of just "." and
    // "..".  (We use OSPATHCHAR instead of '/' though.)
    const char selfWithSep[3] = {'.', OSPATHCHAR, '\0'};
    const char parentWithSep[4] = {'.', '.', OSPATHCHAR, '\0'};
    if ((strcmp(fname, ".") == 0) or (strcmp(fname, selfWithSep) == 0)) return OS_SPECFILE_SELF;
    if ((strcmp(fname, "..") == 0) or (strcmp(fname, parentWithSep) == 0)) return OS_SPECFILE_PARENT;
    return OS_SPECFILE_NONE;
}